

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cc
# Opt level: O2

void __thiscall
tchecker::clock_updates_visitor_t::visit(clock_updates_visitor_t *this,typed_if_statement_t *stmt)

{
  typed_statement_t *ptVar1;
  clock_updates_visitor_t v;
  clock_updates_visitor_t cStack_38;
  
  clock_updates_visitor_t(&cStack_38,this);
  ptVar1 = typed_if_statement_t::then_stmt(stmt);
  (**(code **)(*(long *)ptVar1 + 0x30))(ptVar1,this);
  ptVar1 = typed_if_statement_t::else_stmt(stmt);
  (**(code **)(*(long *)ptVar1 + 0x30))(ptVar1,&cStack_38);
  clock_updates_map_t::absorbing_merge(&this->_u,&cStack_38._u);
  ~clock_updates_visitor_t(&cStack_38);
  return;
}

Assistant:

virtual void visit(tchecker::typed_if_statement_t const & stmt)
  {
    tchecker::clock_updates_visitor_t v(*this);
    stmt.then_stmt().visit(*this);
    stmt.else_stmt().visit(v);
    _u.absorbing_merge(v._u);
  }